

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O3

bool gl4cts::EnhancedLayouts::Utils::checkVarying
               (Program *program,Variable *variable,stringstream *stream,bool is_input)

{
  Interface *pIVar1;
  pointer pDVar2;
  pointer pDVar3;
  pointer pcVar4;
  stringstream *stream_00;
  bool bVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  string structVariable;
  GLchar buffer [16];
  string local_98;
  Program *local_78;
  long local_70;
  Variable *local_68;
  stringstream *local_60;
  pointer local_58;
  pointer local_50;
  char local_48 [24];
  
  bVar5 = Variable::IsBlock(variable);
  if (bVar5) {
    pIVar1 = (variable->m_descriptor).field_9.m_interface;
    lVar7 = (long)(pIVar1->m_members).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(pIVar1->m_members).
                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (lVar7 == 0) {
      bVar5 = true;
    }
    else {
      lVar11 = (lVar7 >> 4) * 0x6db6db6db6db6db7;
      lVar11 = lVar11 + (ulong)(lVar11 == 0);
      local_78 = (Program *)&pIVar1->m_name;
      bVar5 = true;
      lVar7 = 0;
      do {
        bVar6 = verifyVarying(program,(string *)local_78,
                              (Descriptor *)
                              ((long)&((pIVar1->m_members).
                                       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                      m_expected_component + lVar7),stream,is_input);
        bVar5 = (bool)(bVar5 & bVar6);
        lVar7 = lVar7 + 0x70;
        lVar11 = lVar11 + -1;
      } while (lVar11 != 0);
    }
  }
  else {
    bVar5 = Variable::IsStruct(variable);
    if (bVar5) {
      pIVar1 = (variable->m_descriptor).field_9.m_interface;
      pDVar2 = (pIVar1->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar3 = (pIVar1->m_members).
               super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar12 = ((long)pDVar3 - (long)pDVar2 >> 4) * 0x6db6db6db6db6db7;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      pcVar4 = (variable->m_descriptor).m_name._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_98,pcVar4,
                 pcVar4 + (variable->m_descriptor).m_name._M_string_length);
      if ((variable->m_descriptor).m_n_array_elements == 0) {
        if (pDVar3 == pDVar2) {
          bVar5 = true;
        }
        else {
          bVar5 = true;
          uVar8 = 0;
          uVar10 = 1;
          do {
            bVar6 = verifyVarying(program,&local_98,
                                  (pIVar1->m_members).
                                  super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                                  ._M_impl.super__Vector_impl_data._M_start + uVar8,stream,is_input)
            ;
            bVar5 = (bool)(bVar5 & bVar6);
            bVar6 = uVar10 <= uVar12;
            lVar7 = uVar12 - uVar10;
            uVar8 = uVar10;
            uVar10 = (ulong)((int)uVar10 + 1);
          } while (bVar6 && lVar7 != 0);
        }
      }
      else {
        local_70 = uVar12 + (uVar12 == 0);
        bVar5 = true;
        uVar9 = 0;
        local_78 = program;
        local_68 = variable;
        local_60 = stream;
        local_58 = pDVar3;
        local_50 = pDVar2;
        do {
          sprintf(local_48,"%d");
          std::__cxx11::string::append((char *)&local_98);
          std::__cxx11::string::append((char *)&local_98);
          std::__cxx11::string::append((char *)&local_98);
          stream_00 = local_60;
          if (local_58 != local_50) {
            lVar11 = 0;
            lVar7 = local_70;
            do {
              bVar6 = verifyVarying(local_78,&local_98,
                                    (Descriptor *)
                                    ((long)&((pIVar1->m_members).
                                             super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                            m_expected_component + lVar11),stream_00,is_input);
              bVar5 = (bool)(bVar5 & bVar6);
              lVar11 = lVar11 + 0x70;
              lVar7 = lVar7 + -1;
            } while (lVar7 != 0);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (local_68->m_descriptor).m_n_array_elements);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        return bVar5;
      }
    }
    else {
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,0x1af8059);
      bVar5 = verifyVarying(program,&local_98,&variable->m_descriptor,stream,is_input);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p == &local_98.field_2) {
        return bVar5;
      }
    }
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return bVar5;
}

Assistant:

bool checkVarying(Program& program, const Variable& variable, std::stringstream& stream, bool is_input)
{
	bool result = true;

	if (variable.IsBlock())
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;
		const size_t	  n_members = interface->m_members.size();

		for (size_t i = 0; i < n_members; ++i)
		{
			const Variable::Descriptor& member = interface->m_members[i];
			bool member_result				   = verifyVarying(program, interface->m_name, member, stream, is_input);

			if (false == member_result)
			{
				result = false;
			}
		}
	}
	/*
	 To query the the location of struct member by glGetProgramResource, we need pass the variable name "gs_fs_output[0].single",
	 but in original implementation, the test pass the name "Data.single", which can't get any valid result.
	 struct Data {
	 dmat2 single;
	 dmat2 array[1];
	 };
	 layout (location = 0) in Data gs_fs_output[1];
	 */
	else if (variable.IsStruct())
	{
		Utils::Interface* interface		 = variable.m_descriptor.m_interface;
		const size_t	  n_members		 = interface->m_members.size();
		std::string		  structVariable = variable.m_descriptor.m_name;
		// If struct variable is an array
		if (0 != variable.m_descriptor.m_n_array_elements)
		{
			for (GLuint i = 0; i < variable.m_descriptor.m_n_array_elements; i++)
			{
				GLchar buffer[16];
				sprintf(buffer, "%d", i);
				structVariable.append("[");
				structVariable.append(buffer);
				structVariable.append("]");
				for (size_t j = 0; j < n_members; ++j)
				{
					const Variable::Descriptor& member = interface->m_members[j];
					bool member_result = verifyVarying(program, structVariable, member, stream, is_input);

					if (false == member_result)
					{
						result = false;
					}
				}
			}
		}
		else
		{
			for (GLuint i = 0; i < n_members; ++i)
			{
				const Variable::Descriptor& member = interface->m_members[i];
				bool member_result				   = verifyVarying(program, structVariable, member, stream, is_input);

				if (false == member_result)
				{
					result = false;
				}
			}
		}
	}
	else
	{
		result = verifyVarying(program, "", variable.m_descriptor, stream, is_input);
	}
	return result;
}